

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperOpFailure<Struct*,Struct*>
          (internal *this,char *expr1,char *expr2,Struct **val1,Struct **val2,char *op)

{
  AssertionResult *pAVar1;
  Struct **value;
  Struct **value_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  long in_FS_OFFSET;
  AssertionResult AVar2;
  AssertionResult local_90;
  char *local_80;
  char *local_78;
  char *local_70;
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = op;
  local_78 = expr2;
  local_70 = expr1;
  AssertionFailure();
  pAVar1 = AssertionResult::operator<<(&local_90,(char (*) [12])"Expected: (");
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_70);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])") ");
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_80);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x16e44d);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_78);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"), actual: ");
  PrintToString<Struct*>(&local_48,(testing *)val1,value);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_48);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
  PrintToString<Struct*>(&local_68,(testing *)val2,value_00);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_68);
  AssertionResult::AssertionResult((AssertionResult *)this,pAVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    AVar2.message_.ptr_ = extraout_RDX.ptr_;
    AVar2._0_8_ = this;
    return AVar2;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}